

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall r_code::View::~View(View *this)

{
  _Object *p_Var1;
  long lVar2;
  
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__View_001be468;
  lVar2 = 0x58;
  do {
    r_code::Atom::~Atom((Atom *)((long)this->references + lVar2 + -0x10));
    lVar2 = lVar2 + -4;
  } while (lVar2 != 0x24);
  p_Var1 = (this->object).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
      return;
    }
  }
  return;
}

Assistant:

virtual ~View() {}